

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalTypeOptimization.cpp
# Opt level: O0

Pass * wasm::createGlobalTypeOptimizationPass(void)

{
  GlobalTypeOptimization *this;
  
  this = (GlobalTypeOptimization *)operator_new(0xd8);
  memset(this,0,0xd8);
  anon_unknown_226::GlobalTypeOptimization::GlobalTypeOptimization(this);
  return &this->super_Pass;
}

Assistant:

Pass* createGlobalTypeOptimizationPass() {
  return new GlobalTypeOptimization();
}